

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_2::FileState::Unref(FileState *this)

{
  pointer ppcVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  iVar2 = this->refs_;
  this->refs_ = iVar2 + -1;
  if (0 < iVar2) {
    pthread_mutex_unlock((pthread_mutex_t *)this);
    if (iVar2 == 1) {
      Truncate(this);
      ppcVar1 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppcVar1 != (pointer)0x0) {
        operator_delete(ppcVar1);
      }
      operator_delete(this);
      return;
    }
    return;
  }
  __assert_fail("refs_ >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv.cc"
                ,0x2e,"void leveldb::(anonymous namespace)::FileState::Unref()");
}

Assistant:

void Unref() {
    bool do_delete = false;

    {
      MutexLock lock(&refs_mutex_);
      --refs_;
      assert(refs_ >= 0);
      if (refs_ <= 0) {
        do_delete = true;
      }
    }

    if (do_delete) {
      delete this;
    }
  }